

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O2

ion_err_t bpptree_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_bpp_open_t info_00;
  int iVar1;
  ion_bpp_err_t iVar2;
  ion_dictionary_parent_t *piVar3;
  ion_file_handle_t pFVar4;
  ion_err_t iVar5;
  ion_bpp_open_t info;
  char addr_filename [12];
  char value_filename [20];
  
  piVar3 = (ion_dictionary_parent_t *)malloc(0x38);
  if (piVar3 == (ion_dictionary_parent_t *)0x0) {
    iVar5 = '\x06';
  }
  else {
    bpptree_get_filename(id,value_filename);
    pFVar4 = ion_fopen(value_filename);
    *(ion_file_handle_t *)&piVar3[1].record.value_size = pFVar4;
    piVar3[1].compare = (ion_dictionary_compare_t)0xffffffffffffffff;
    iVar1 = dictionary_get_filename(id,"bpt",addr_filename);
    iVar5 = '\x12';
    if (iVar1 < 0xc) {
      info_00.keySize = key_size;
      info_00.iName = addr_filename;
      info_00.dupKeys = 0;
      info_00.sectorSize = 0x100;
      info_00.comp = compare;
      iVar2 = b_open(info_00,(ion_bpp_handle_t *)(piVar3 + 1));
      if ((handler != (ion_dictionary_handler_t *)0x0) && (iVar2 == bErrOk)) {
        dictionary->instance = piVar3;
        piVar3->compare = compare;
        piVar3->key_type = key_type;
        (piVar3->record).key_size = key_size;
        (piVar3->record).value_size = value_size;
        piVar3->type = dictionary_type_bpp_tree_t;
        dictionary->handler = handler;
        iVar5 = '\0';
      }
    }
  }
  return iVar5;
}

Assistant:

ion_err_t
bpptree_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(dictionary_size);

/*	if (key_size != sizeof(int)) {
		return err_invalid_initial_size;
	}*/

	ion_bpptree_t	*bpptree;
	ion_bpp_open_t	info;

	bpptree = malloc(sizeof(ion_bpptree_t));

	if (NULL == bpptree) {
		return err_out_of_memory;
	}

	char value_filename[20];

	bpptree_get_filename(id, value_filename);
	bpptree->values.file_handle = ion_fopen(value_filename);

	bpptree->values.next_empty	= ION_FILE_NULL;

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	int actual_filename_length = dictionary_get_filename(id, "bpt", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	info.iName		= addr_filename;
	info.keySize	= key_size;
	info.dupKeys	= boolean_false;
	info.sectorSize = 256;
	info.comp		= compare;

	ion_bpp_err_t bErr = b_open(info, &(bpptree->tree));

	if (bErrOk != bErr) {
		return err_uninitialized;
	}

	if (NULL == handler) {
		return err_uninitialized;
	}

	dictionary->instance					= (ion_dictionary_parent_t *) bpptree;
	dictionary->instance->compare			= compare;
	dictionary->instance->key_type			= key_type;
	dictionary->instance->record.key_size	= key_size;
	dictionary->instance->record.value_size = value_size;
	dictionary->instance->type				= dictionary_type_bpp_tree_t;
	dictionary->handler						= handler;

	return err_ok;
}